

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void print<just::lines::iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,false>>
               (iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                *begin_,iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                        *end_)

{
  pointer pcVar1;
  ostream *poVar2;
  iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  i;
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  value_type local_30;
  
  local_68[0x10] = begin_->_at_end;
  local_68._0_4_ = *(undefined4 *)&(begin_->_at)._M_current;
  local_68._4_4_ = *(undefined4 *)((long)&(begin_->_at)._M_current + 4);
  local_68._8_4_ = *(undefined4 *)&(begin_->_end)._M_current;
  local_68._12_4_ = *(undefined4 *)((long)&(begin_->_end)._M_current + 4);
  pcVar1 = (begin_->_current)._M_dataplus._M_p;
  local_50._M_p = (pointer)&local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (begin_->_current)._M_string_length);
  local_30 = begin_->_last_char;
  do {
    if (((local_68[0x10] | end_->_at_end) & 1U) == 0) {
      if ((char *)CONCAT44(local_68._4_4_,local_68._0_4_) == (end_->_at)._M_current) {
LAB_0010377d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_p != &local_40) {
          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
        }
        return;
      }
    }
    else if ((local_68[0x10] & end_->_at_end) == 1) goto LAB_0010377d;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_50._M_p,local_48);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    just::lines::
    iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ::operator++((iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                  *)local_68);
  } while( true );
}

Assistant:

void print(InputIt begin_, InputIt end_)
{
  for (InputIt i = begin_; i != end_; ++i)
  {
    std::cout << *i << std::endl;
  }
}